

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collate_expression.cpp
# Opt level: O1

string * __thiscall
duckdb::CollateExpression::ToString_abi_cxx11_
          (string *__return_storage_ptr__,CollateExpression *this)

{
  pointer pcVar1;
  pointer pPVar2;
  SQLIdentifier *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  string local_40;
  
  local_60[0] = local_50;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"%s COLLATE %s","");
  pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&this->child);
  (*(pPVar2->super_BaseExpression)._vptr_BaseExpression[8])(&local_40,pPVar2);
  pcVar1 = (this->collation)._M_dataplus._M_p;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,pcVar1 + (this->collation)._M_string_length);
  StringUtil::Format<std::__cxx11::string,duckdb::SQLIdentifier>
            (__return_storage_ptr__,(StringUtil *)local_60,&local_40,&local_80,in_R8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

string CollateExpression::ToString() const {
	return StringUtil::Format("%s COLLATE %s", child->ToString(), SQLIdentifier(collation));
}